

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O3

double __thiscall
duckdb::Interpolator<false>::Extract<long,double>
          (Interpolator<false> *this,long *dest,Vector *result)

{
  duckdb *pdVar1;
  bool bVar2;
  double dVar3;
  undefined1 auVar4 [16];
  double result_1;
  double local_50;
  string local_48;
  double local_28;
  
  pdVar1 = (duckdb *)*dest;
  if (this->CRN == this->FRN) {
    bVar2 = duckdb::TryCast::Operation<long,double>((long)pdVar1,&local_50,false);
    if (!bVar2) {
      auVar4 = __cxa_allocate_exception(0x10);
      CastExceptionText<long,double>(&local_48,pdVar1,auVar4._8_8_);
      duckdb::InvalidInputException::InvalidInputException(auVar4._0_8_,(string *)&local_48);
      __cxa_throw(auVar4._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    bVar2 = duckdb::TryCast::Operation<long,double>((long)pdVar1,&local_50,false);
    if (!bVar2) {
      auVar4 = __cxa_allocate_exception(0x10);
      CastExceptionText<long,double>(&local_48,pdVar1,auVar4._8_8_);
      duckdb::InvalidInputException::InvalidInputException(auVar4._0_8_,(string *)&local_48);
      __cxa_throw(auVar4._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    local_28 = local_50;
    pdVar1 = (duckdb *)dest[1];
    bVar2 = duckdb::TryCast::Operation<long,double>((long)pdVar1,&local_50,false);
    if (!bVar2) {
      auVar4 = __cxa_allocate_exception(0x10);
      CastExceptionText<long,double>(&local_48,pdVar1,auVar4._8_8_);
      duckdb::InvalidInputException::InvalidInputException(auVar4._0_8_,(string *)&local_48);
      __cxa_throw(auVar4._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    dVar3 = this->RN -
            (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0));
    local_50 = dVar3 * local_50 + local_28 * (1.0 - dVar3);
  }
  return local_50;
}

Assistant:

inline TARGET_TYPE Extract(const INPUT_TYPE *dest, Vector &result) const {
		if (CRN == FRN) {
			return CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[0], result);
		} else {
			auto lo = CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[0], result);
			auto hi = CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[1], result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}